

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O2

String __thiscall
xmrig::OclLib::getProgramBuildLog(OclLib *this,cl_program program,cl_device_id device)

{
  ulong __n;
  size_t sVar1;
  cl_int cVar2;
  char *str;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar3;
  size_t extraout_RDX_01;
  String SVar4;
  size_t size;
  size_t local_38;
  
  local_38 = 0;
  cVar2 = getProgramBuildInfo(program,device,0x1183,0,(void *)0x0,&local_38);
  sVar1 = local_38;
  sVar3 = extraout_RDX;
  if (cVar2 == 0) {
    __n = local_38 + 1;
    str = (char *)operator_new__(__n);
    memset(str,0,__n);
    cVar2 = getProgramBuildInfo(program,device,0x1183,sVar1,str,(size_t *)0x0);
    if (cVar2 == 0) {
      String::String((String *)this,str);
      sVar3 = extraout_RDX_01;
      goto LAB_00172e15;
    }
    operator_delete__(str);
    sVar3 = extraout_RDX_00;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_00172e15:
  SVar4.m_size = sVar3;
  SVar4.m_data = (char *)this;
  return SVar4;
}

Assistant:

xmrig::String xmrig::OclLib::getProgramBuildLog(cl_program program, cl_device_id device) noexcept
{
    size_t size = 0;
    if (getProgramBuildInfo(program, device, CL_PROGRAM_BUILD_LOG, 0, nullptr, &size) != CL_SUCCESS) {
        return String();
    }

    char *log = new char[size + 1]();

    if (getProgramBuildInfo(program, device, CL_PROGRAM_BUILD_LOG, size, log, nullptr) != CL_SUCCESS) {
        delete [] log;
        return String();
    }

    return log;
}